

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

CURLcode Curl_ssl_scache_take
                   (Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key,Curl_ssl_session **ps)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Curl_ssl_session **ppCVar4;
  char *data_00;
  CURLcode CVar5;
  time_t now;
  Curl_llist_node *pCVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvStack_58;
  CURLcode result;
  Curl_ssl_session *s;
  Curl_llist_node *n;
  Curl_ssl_scache_peer *peer;
  ssl_primary_config *conn_config;
  Curl_ssl_scache *scache;
  Curl_ssl_session **ps_local;
  char *ssl_peer_key_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  scache = (Curl_ssl_scache *)ps;
  ps_local = (Curl_ssl_session **)ssl_peer_key;
  ssl_peer_key_local = (char *)data;
  data_local = (Curl_easy *)cf;
  conn_config = (ssl_primary_config *)cf_ssl_scache_get(data);
  peer = (Curl_ssl_scache_peer *)Curl_ssl_cf_get_primary_config((Curl_cfilter *)data_local);
  n = (Curl_llist_node *)0x0;
  pvStack_58 = (void *)0x0;
  *(undefined8 *)scache = 0;
  if (conn_config == (ssl_primary_config *)0x0) {
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_ssl_scache_lock((Curl_easy *)ssl_peer_key_local);
    CVar5 = cf_ssl_find_peer_by_key
                      ((Curl_easy *)ssl_peer_key_local,(Curl_ssl_scache *)conn_config,
                       (char *)ps_local,(ssl_primary_config *)peer,(Curl_ssl_scache_peer **)&n);
    pCVar6 = n;
    if ((CVar5 == CURLE_OK) && (n != (Curl_llist_node *)0x0)) {
      now = time((time_t *)0x0);
      cf_scache_peer_remove_expired((Curl_ssl_scache_peer *)pCVar6,now);
      pCVar6 = Curl_llist_head((Curl_llist *)(n + 1));
      if (pCVar6 != (Curl_llist_node *)0x0) {
        pvStack_58 = Curl_node_take_elem(pCVar6);
        conn_config->cipher_list = conn_config->cipher_list + 1;
        n[4]._next = (Curl_llist_node *)conn_config->cipher_list;
      }
    }
    Curl_ssl_scache_unlock((Curl_easy *)ssl_peer_key_local);
    data_00 = ssl_peer_key_local;
    ppCVar4 = ps_local;
    cf_local._4_4_ = CVar5;
    if (pvStack_58 == (void *)0x0) {
      if ((((ssl_peer_key_local != (char *)0x0) &&
           ((*(ulong *)(ssl_peer_key_local + 0xa2c) >> 0x1e & 1) != 0)) &&
          ((*(long *)(ssl_peer_key_local + 0x1310) == 0 ||
           (0 < *(int *)(*(long *)(ssl_peer_key_local + 0x1310) + 8))))) &&
         (0 < Curl_trc_feat_ssls.log_level)) {
        Curl_trc_ssls((Curl_easy *)ssl_peer_key_local,"no cached session for %s",ps_local);
      }
    }
    else {
      *(void **)scache = pvStack_58;
      if (((ssl_peer_key_local != (char *)0x0) &&
          ((*(ulong *)(ssl_peer_key_local + 0xa2c) >> 0x1e & 1) != 0)) &&
         (((*(long *)(ssl_peer_key_local + 0x1310) == 0 ||
           (0 < *(int *)(*(long *)(ssl_peer_key_local + 0x1310) + 8))) &&
          (0 < Curl_trc_feat_ssls.log_level)))) {
        uVar1 = *(uint *)((long)pvStack_58 + 0x18);
        uVar2 = *(undefined8 *)((long)pvStack_58 + 0x20);
        uVar3 = *(undefined8 *)((long)pvStack_58 + 0x28);
        pcVar7 = "no";
        if (*(long *)((long)pvStack_58 + 0x30) != 0) {
          pcVar7 = "yes";
        }
        sVar8 = Curl_llist_count((Curl_llist *)(n + 1));
        Curl_trc_ssls((Curl_easy *)data_00,
                      "took session for %s [proto=0x%x, alpn=%s, earlydata=%zu, quic_tp=%s], %zu sessions remain"
                      ,ppCVar4,(ulong)uVar1,uVar2,uVar3,pcVar7,sVar8);
      }
    }
  }
  return cf_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_scache_take(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              const char *ssl_peer_key,
                              struct Curl_ssl_session **ps)
{
  struct Curl_ssl_scache *scache = cf_ssl_scache_get(data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_ssl_scache_peer *peer = NULL;
  struct Curl_llist_node *n;
  struct Curl_ssl_session *s = NULL;
  CURLcode result;

  *ps = NULL;
  if(!scache)
    return CURLE_OK;

  Curl_ssl_scache_lock(data);
  result = cf_ssl_find_peer_by_key(data, scache, ssl_peer_key, conn_config,
                                   &peer);
  if(!result && peer) {
    cf_scache_peer_remove_expired(peer, (curl_off_t)time(NULL));
    n = Curl_llist_head(&peer->sessions);
    if(n) {
      s = Curl_node_take_elem(n);
      (scache->age)++;            /* increase general age */
      peer->age = scache->age; /* set this as used in this age */
    }
  }
  Curl_ssl_scache_unlock(data);
  if(s) {
    *ps = s;
    CURL_TRC_SSLS(data, "took session for %s [proto=0x%x, "
                  "alpn=%s, earlydata=%zu, quic_tp=%s], %zu sessions remain",
                  ssl_peer_key, s->ietf_tls_id, s->alpn,
                  s->earlydata_max, s->quic_tp ? "yes" : "no",
                  Curl_llist_count(&peer->sessions));
  }
  else {
    CURL_TRC_SSLS(data, "no cached session for %s", ssl_peer_key);
  }
  return result;
}